

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_dec.c
# Opt level: O1

int VP8LDecodeAlphaImageStream(ALPHDecoder *alph_dec,int last_row)

{
  VP8LBitReader *br;
  int *piVar1;
  ushort uVar2;
  int width;
  int iVar3;
  VP8LDecoder *dec;
  uint32_t *data;
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  uint32_t uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  byte bVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  HuffmanCode *pHVar18;
  uint *__src;
  undefined1 *__dest;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  HTreeGroup *local_58;
  
  dec = alph_dec->vp8l_dec_;
  iVar15 = 1;
  if (dec->last_row_ < last_row) {
    if (alph_dec->use_8b_decode_ == 0) {
      WebPInitAlphaProcessing();
    }
    data = dec->pixels_;
    width = dec->width_;
    if (alph_dec->use_8b_decode_ == 0) {
      iVar15 = DecodeImageData(dec,data,width,dec->height_,last_row,ExtractAlphaRows);
      return iVar15;
    }
    iVar19 = dec->last_pixel_;
    uVar13 = (long)iVar19 / (long)width;
    uVar6 = (long)iVar19 % (long)width;
    uVar23 = uVar13 & 0xffffffff;
    uVar20 = uVar6 & 0xffffffff;
    iVar8 = width * last_row;
    if (iVar19 < iVar8) {
      iVar15 = (dec->hdr_).huffman_subsample_bits_;
      if (iVar15 == 0) {
        lVar12 = 0;
      }
      else {
        bVar14 = (byte)iVar15;
        lVar12 = (long)(int)(dec->hdr_).huffman_image_
                            [((int)uVar6 >> (bVar14 & 0x1f)) +
                             ((int)uVar13 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
      }
      local_58 = (dec->hdr_).htree_groups_ + lVar12;
    }
    else {
      local_58 = (HTreeGroup *)0x0;
    }
    uVar11 = (dec->hdr_).huffman_mask_;
    br = &dec->br_;
    iVar9 = dec->height_ * width;
    bVar7 = true;
    do {
      uVar17 = (uint)uVar23;
      if (((dec->br_).eos_ != 0) || (iVar8 <= iVar19)) {
        if ((int)uVar17 < last_row) {
          last_row = uVar17;
        }
        ExtractPalettedAlphaRows(dec,last_row);
        goto LAB_0010aaa7;
      }
      uVar22 = (uint)uVar20;
      if ((uVar11 & uVar22) == 0) {
        iVar15 = (dec->hdr_).huffman_subsample_bits_;
        if (iVar15 == 0) {
          lVar12 = 0;
        }
        else {
          bVar14 = (byte)iVar15;
          lVar12 = (long)(int)(dec->hdr_).huffman_image_
                              [((int)uVar22 >> (bVar14 & 0x1f)) +
                               ((int)uVar17 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
        }
        local_58 = (dec->hdr_).htree_groups_ + lVar12;
      }
      if (0x1f < (dec->br_).bit_pos_) {
        VP8LDoFillBitWindow(br);
      }
      uVar13 = (dec->br_).val_;
      iVar15 = (dec->br_).bit_pos_;
      pHVar18 = local_58->htrees[0] + (uVar13 >> ((byte)iVar15 & 0x3f) & 0xff);
      bVar14 = pHVar18->bits;
      if (8 < bVar14) {
        iVar15 = iVar15 + 8;
        (dec->br_).bit_pos_ = iVar15;
        pHVar18 = pHVar18 + (ulong)pHVar18->value +
                            (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                   (uint)(uVar13 >> ((byte)iVar15 & 0x3f)));
      }
      piVar1 = &(dec->br_).bit_pos_;
      *piVar1 = *piVar1 + (uint)pHVar18->bits;
      uVar2 = pHVar18->value;
      if (uVar2 < 0x100) {
        *(char *)((long)data + (long)iVar19) = (char)uVar2;
        iVar19 = iVar19 + 1;
        uVar20 = (ulong)(uVar22 + 1);
        if (width <= (int)(uVar22 + 1)) {
          uVar22 = uVar17 + 1;
          bVar4 = (int)uVar17 < last_row;
          uVar20 = 0;
          uVar17 = uVar22;
          if ((uVar22 & 0xf) == 0 && bVar4) {
            ExtractPalettedAlphaRows(dec,uVar22);
          }
        }
LAB_0010aa5c:
        uVar22 = 1;
        if (((dec->br_).eos_ == 0) && (uVar22 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
          uVar22 = (uint)(0x40 < (dec->br_).bit_pos_);
        }
        (dec->br_).eos_ = uVar22;
        iVar15 = 0;
      }
      else if (uVar2 < 0x118) {
        uVar21 = (uint)uVar2;
        if (uVar21 < 0x104) {
          uVar21 = uVar21 - 0x100;
        }
        else {
          uVar16 = uVar2 - 0x102 >> 1;
          uVar10 = VP8LReadBits(br,uVar16);
          uVar21 = uVar10 + ((uVar21 & 1 | 2) << ((byte)uVar16 & 0x1f));
        }
        uVar13 = (dec->br_).val_;
        iVar15 = (dec->br_).bit_pos_;
        pHVar18 = local_58->htrees[4] + (uVar13 >> ((byte)iVar15 & 0x3f) & 0xff);
        bVar14 = pHVar18->bits;
        if (8 < bVar14) {
          iVar15 = iVar15 + 8;
          (dec->br_).bit_pos_ = iVar15;
          pHVar18 = pHVar18 + (ulong)pHVar18->value +
                              (ulong)(~(-1 << (bVar14 - 8 & 0x1f)) &
                                     (uint)(uVar13 >> ((byte)iVar15 & 0x3f)));
        }
        iVar15 = (uint)pHVar18->bits + (dec->br_).bit_pos_;
        (dec->br_).bit_pos_ = iVar15;
        uVar2 = pHVar18->value;
        uVar16 = (uint)uVar2;
        if (0x1f < iVar15) {
          VP8LDoFillBitWindow(br);
        }
        if (3 < uVar2) {
          uVar16 = uVar2 - 2 >> 1;
          uVar10 = VP8LReadBits(br,uVar16);
          uVar16 = uVar10 + ((uVar2 & 1 | 2) << ((byte)uVar16 & 0x1f));
        }
        if ((int)(uVar16 + 1) < 0x79) {
          iVar15 = ((uint)("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                           [(int)uVar16] >> 4) * width -
                   ("\x18\a\x17\x19(\x06\')\x16\x1a&*8\x0579\x15\x1b6:%+H\x04GI\x14\x1c5;FJ$,XEK4<\x03WY\x13\x1dVZ#-DLU[3=h\x02gi\x12\x1efj\".T\\CMek2>x\x01wyS]\x11\x1fdlBNvz!/u{1?cmR^"
                    [(int)uVar16] & 0xf)) + 8;
          if (iVar15 < 2) {
            iVar15 = 1;
          }
        }
        else {
          iVar15 = uVar16 - 0x77;
        }
        uVar16 = uVar21 + 1;
        bVar4 = iVar15 <= iVar19;
        bVar5 = (int)uVar16 <= iVar9 - iVar19;
        if (bVar5 && bVar4) {
          __dest = (undefined1 *)((long)data + (long)iVar19);
          __src = (uint *)(__dest + -(long)iVar15);
          lVar12 = -(long)iVar15;
          if ((int)uVar16 < 8) {
LAB_0010a8e5:
            if (iVar15 < (int)uVar16) {
              if (uVar21 < 0x7fffffff) {
                uVar13 = (ulong)uVar16;
                do {
                  *__dest = __dest[lVar12];
                  __dest = __dest + 1;
                  uVar13 = uVar13 - 1;
                } while (uVar13 != 0);
              }
            }
            else {
              memcpy(__dest,__src,(long)(int)uVar16);
            }
          }
          else {
            if (iVar15 == 4) {
              uVar17 = *__src;
            }
            else if (iVar15 == 2) {
              uVar17 = CONCAT22((short)*__src,(short)*__src);
            }
            else {
              if (iVar15 != 1) goto LAB_0010a8e5;
              uVar17 = (uint)(byte)*__src * 0x1010101;
            }
            uVar21 = uVar16;
            if (((ulong)__dest & 3) != 0) {
              uVar13 = (long)data + (long)iVar19 + 1;
              do {
                *__dest = __dest[lVar12];
                __dest = __dest + 1;
                uVar17 = uVar17 << 0x18 | uVar17 >> 8;
                uVar21 = uVar21 - 1;
                uVar6 = uVar13 & 3;
                uVar13 = uVar13 + 1;
              } while (uVar6 != 0);
              __src = (uint *)(__dest + lVar12);
            }
            if ((int)uVar21 >> 2 < 1) {
              uVar13 = 0;
            }
            else {
              uVar13 = 0;
              do {
                *(uint *)(__dest + uVar13 * 4) = uVar17;
                uVar13 = uVar13 + 1;
              } while ((uint)((int)uVar21 >> 2) != uVar13);
            }
            if ((int)uVar13 * 4 < (int)uVar21) {
              uVar13 = (uVar13 & 0xffffffff) << 2;
              do {
                __dest[uVar13] = *(byte *)((long)__src + uVar13);
                uVar13 = uVar13 + 1;
              } while (uVar21 != uVar13);
            }
          }
          uVar22 = uVar22 + uVar16;
          while( true ) {
            uVar20 = (ulong)uVar22;
            uVar17 = (uint)uVar23;
            if ((int)uVar22 < width) break;
            uVar21 = uVar17 + 1;
            uVar23 = (ulong)uVar21;
            if ((uVar21 & 0xf) == 0 && (int)uVar17 < last_row) {
              ExtractPalettedAlphaRows(dec,uVar21);
            }
            uVar22 = uVar22 - width;
          }
          iVar19 = uVar16 + iVar19;
          iVar15 = 0;
          if ((iVar19 < iVar8) && ((uVar22 & uVar11) != 0)) {
            iVar3 = (dec->hdr_).huffman_subsample_bits_;
            if (iVar3 == 0) {
              lVar12 = 0;
            }
            else {
              bVar14 = (byte)iVar3;
              lVar12 = (long)(int)(dec->hdr_).huffman_image_
                                  [((int)uVar22 >> (bVar14 & 0x1f)) +
                                   ((int)uVar17 >> (bVar14 & 0x1f)) * (dec->hdr_).huffman_xsize_];
            }
            local_58 = (dec->hdr_).htree_groups_ + lVar12;
          }
        }
        else {
          iVar15 = 4;
          bVar7 = false;
        }
        if (bVar5 && bVar4) goto LAB_0010aa5c;
      }
      else {
        iVar15 = 4;
        bVar7 = false;
      }
      uVar23 = (ulong)uVar17;
    } while (iVar15 == 0);
    if (iVar15 == 4) {
LAB_0010aaa7:
      uVar11 = 1;
      if (((dec->br_).eos_ == 0) && (uVar11 = 0, (dec->br_).pos_ == (dec->br_).len_)) {
        uVar11 = (uint)(0x40 < (dec->br_).bit_pos_);
      }
      (dec->br_).eos_ = uVar11;
      if ((bVar7) && ((uVar11 == 0 || (iVar9 <= iVar19)))) {
        dec->last_pixel_ = iVar19;
        iVar15 = 1;
      }
      else {
        dec->status_ = uVar11 * 2 + VP8_STATUS_BITSTREAM_ERROR;
        iVar15 = 0;
      }
    }
  }
  return iVar15;
}

Assistant:

int VP8LDecodeAlphaImageStream(ALPHDecoder* const alph_dec, int last_row) {
  VP8LDecoder* const dec = alph_dec->vp8l_dec_;
  assert(dec != NULL);
  assert(last_row <= dec->height_);

  if (dec->last_row_ >= last_row) {
    return 1;  // done
  }

  if (!alph_dec->use_8b_decode_) WebPInitAlphaProcessing();

  // Decode (with special row processing).
  return alph_dec->use_8b_decode_ ?
      DecodeAlphaData(dec, (uint8_t*)dec->pixels_, dec->width_, dec->height_,
                      last_row) :
      DecodeImageData(dec, dec->pixels_, dec->width_, dec->height_,
                      last_row, ExtractAlphaRows);
}